

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.c
# Opt level: O1

void rewrite_file(char *filename,char *data)

{
  FILE *__stream;
  
  __stream = fopen(filename,"w");
  if (__stream != (FILE *)0x0) {
    fputs(data,__stream);
    fclose(__stream);
    return;
  }
  printf("Could not open file %s to write results\n",filename);
  return;
}

Assistant:

void rewrite_file (char const * filename,
                   char const * data) {

  FILE * file_handler = fopen (filename, "w");
  if (!file_handler) {
    printf ("Could not open file %s to write results\n", filename);
    return;
  }
  fputs (data, file_handler);
  fclose (file_handler);
  return;
}